

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O2

double __thiscall lightconf::scanner::expect_number(scanner *this)

{
  undefined4 uVar1;
  double dVar2;
  token *tok;
  token *tok_00;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  double local_f0;
  char local_e8;
  undefined8 local_e4;
  int local_dc;
  undefined1 local_d8 [52];
  int local_a4;
  undefined1 local_98 [56];
  int local_60;
  undefined1 local_58 [64];
  
  skip_whitespace(this,false);
  cur_token((token *)local_118,this);
  uVar1 = local_118._0_4_;
  std::__cxx11::string::~string((string *)&local_110);
  if (uVar1 != number_token) {
    local_118._0_4_ = number_token;
    local_110._M_p = (pointer)&local_100;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_f0 = 0.0;
    local_e8 = '\0';
    local_e4._0_4_ = 0;
    local_e4._4_4_ = 0;
    local_dc = 0;
    token_name_abi_cxx11_(&local_198,(lightconf *)local_118,tok);
    std::operator+(&local_178,"expected ",&local_198);
    std::operator+(&local_158,&local_178," but found ");
    cur_token((token *)local_58,this);
    token_name_abi_cxx11_(&local_1b8,(lightconf *)local_58,tok_00);
    std::operator+(&local_138,&local_158,&local_1b8);
    cur_token((token *)local_98,this);
    cur_token((token *)local_d8,this);
    fail(this,&local_138,local_60,local_a4);
    std::__cxx11::string::~string((string *)(local_d8 + 8));
    std::__cxx11::string::~string((string *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_110);
  }
  cur_token((token *)local_118,this);
  dVar2 = local_f0;
  std::__cxx11::string::~string((string *)&local_110);
  next_token(this);
  return dVar2;
}

Assistant:

inline double scanner::expect_number() {
    skip_whitespace(false);
    if (cur_token().type != token_type::number_token) {
        fail("expected " + token_name(token(token_type::number_token)) + " but found " + token_name(cur_token()),
            cur_token().line, cur_token().pos);
    }
    double val = cur_token().number_value;
    next_token();
    return val;
}